

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O1

void __thiscall
tcu::CaseListFilter::CaseListFilter(CaseListFilter *this,CommandLine *cmdLine,Archive *archive)

{
  MovePtr<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_> *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  Entry *pEVar4;
  CaseTreeNode *pCVar5;
  undefined4 extraout_var;
  CasePaths *__return_storage_ptr__;
  Exception *pEVar6;
  long *plVar7;
  size_type *psVar8;
  vector<char,_std::allocator<char>_> buffer;
  istringstream str;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  int aiStack_218 [22];
  ios_base local_1c0 [400];
  
  this_00 = &this->m_casePaths;
  this->m_caseTree = (CaseTreeNode *)0x0;
  (this->m_casePaths).
  super_UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>.m_data.ptr =
       (CasePaths *)0x0;
  bVar1 = de::cmdline::detail::TypedFieldMap::contains
                    (&cmdLine->m_options,(type_info *)&opt::CaseList::typeinfo);
  if (bVar1) {
    pEVar4 = de::cmdline::detail::TypedFieldMap::get
                       (&cmdLine->m_options,(type_info *)&opt::CaseList::typeinfo);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_238,(string *)pEVar4->value,_S_in);
    pCVar5 = parseCaseList((istream *)&local_238);
    this->m_caseTree = pCVar5;
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_238);
    std::ios_base::~ios_base(local_1c0);
  }
  else {
    bVar1 = de::cmdline::detail::TypedFieldMap::contains
                      (&cmdLine->m_options,(type_info *)&opt::CaseListFile::typeinfo);
    if (bVar1) {
      pEVar4 = de::cmdline::detail::TypedFieldMap::get
                         (&cmdLine->m_options,(type_info *)&opt::CaseListFile::typeinfo);
      std::ifstream::ifstream(&local_238,*pEVar4->value,_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if ((cVar2 == '\0') ||
         (*(int *)((long)aiStack_218 + *(long *)(local_238._M_dataplus._M_p + -0x18)) != 0)) {
        pEVar6 = (Exception *)__cxa_allocate_exception(0x30);
        pEVar4 = de::cmdline::detail::TypedFieldMap::get
                           (&cmdLine->m_options,(type_info *)&opt::CaseListFile::typeinfo);
        std::operator+(&local_258,"Failed to open case list file \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pEVar4->value);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
        local_278._M_dataplus._M_p = (pointer)*plVar7;
        psVar8 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_278._M_dataplus._M_p == psVar8) {
          local_278.field_2._M_allocated_capacity = *psVar8;
          local_278.field_2._8_8_ = plVar7[3];
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar8;
        }
        local_278._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        Exception::Exception(pEVar6,&local_278);
        __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
      }
      pCVar5 = parseCaseList((istream *)&local_238);
      this->m_caseTree = pCVar5;
      std::ifstream::~ifstream(&local_238);
    }
    else {
      bVar1 = de::cmdline::detail::TypedFieldMap::contains
                        (&cmdLine->m_options,(type_info *)&opt::CaseListResource::typeinfo);
      if (bVar1) {
        pEVar4 = de::cmdline::detail::TypedFieldMap::get
                           (&cmdLine->m_options,(type_info *)&opt::CaseListResource::typeinfo);
        iVar3 = (*archive->_vptr_Archive[2])(archive,*pEVar4->value);
        plVar7 = (long *)CONCAT44(extraout_var,iVar3);
        iVar3 = (**(code **)(*plVar7 + 0x18))(plVar7);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_258,(long)iVar3,
                   (allocator_type *)&local_238);
        if (local_258._M_dataplus._M_p == (pointer)local_258._M_string_length) {
          pEVar6 = (Exception *)__cxa_allocate_exception(0x30);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,"Empty case list resource","");
          Exception::Exception(pEVar6,&local_238);
          __cxa_throw(pEVar6,&Exception::typeinfo,Exception::~Exception);
        }
        (**(code **)(*plVar7 + 0x10))(plVar7,local_258._M_dataplus._M_p,iVar3);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,local_258._M_dataplus._M_p,
                   local_258._M_dataplus._M_p + iVar3);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_238,(string *)&local_278,_S_in);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        pCVar5 = parseCaseList((istream *)&local_238);
        this->m_caseTree = pCVar5;
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_238);
        std::ios_base::~ios_base(local_1c0);
        if (local_258._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_258._M_dataplus._M_p,
                          local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p
                         );
        }
        (**(code **)(*plVar7 + 8))(plVar7);
      }
      else {
        pEVar4 = de::cmdline::detail::TypedFieldMap::get
                           (&cmdLine->m_options,(type_info *)&opt::StdinCaseList::typeinfo);
        if (*pEVar4->value == '\x01') {
          pCVar5 = parseCaseList((istream *)&std::cin);
          this->m_caseTree = pCVar5;
        }
        else {
          bVar1 = de::cmdline::detail::TypedFieldMap::contains
                            (&cmdLine->m_options,(type_info *)&opt::CasePath::typeinfo);
          if (bVar1) {
            __return_storage_ptr__ = (CasePaths *)operator_new(0x18);
            pEVar4 = de::cmdline::detail::TypedFieldMap::get
                               (&cmdLine->m_options,(type_info *)&opt::CasePath::typeinfo);
            de::splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)__return_storage_ptr__,(string *)pEVar4->value,',');
            local_238._M_dataplus._M_p = (pointer)0x0;
            if ((this_00->
                super_UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>).
                m_data.ptr != __return_storage_ptr__) {
              de::details::
              UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>::reset
                        (&this_00->
                          super_UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>
                        );
              (this_00->
              super_UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>).
              m_data.ptr = __return_storage_ptr__;
            }
            de::details::UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>
            ::reset((UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_> *)
                    &local_238);
          }
        }
      }
    }
  }
  return;
}

Assistant:

CaseListFilter::CaseListFilter (const de::cmdline::CommandLine& cmdLine, const tcu::Archive& archive)
	: m_caseTree(DE_NULL)
{
	if (cmdLine.hasOption<opt::CaseList>())
	{
		std::istringstream str(cmdLine.getOption<opt::CaseList>());

		m_caseTree = parseCaseList(str);
	}
	else if (cmdLine.hasOption<opt::CaseListFile>())
	{
		std::ifstream in(cmdLine.getOption<opt::CaseListFile>().c_str(), std::ios_base::binary);

		if (!in.is_open() || !in.good())
			throw Exception("Failed to open case list file '" + cmdLine.getOption<opt::CaseListFile>() + "'");

		m_caseTree = parseCaseList(in);
	}
	else if (cmdLine.hasOption<opt::CaseListResource>())
	{
		// \todo [2016-11-14 pyry] We are cloning potentially large buffers here. Consider writing
		//						   istream adaptor for tcu::Resource.
		de::UniquePtr<Resource>	caseListResource	(archive.getResource(cmdLine.getOption<opt::CaseListResource>().c_str()));
		const int				bufferSize			= caseListResource->getSize();
		std::vector<char>		buffer				((size_t)bufferSize);

		if (buffer.empty())
			throw Exception("Empty case list resource");

		caseListResource->read(reinterpret_cast<deUint8*>(&buffer[0]), bufferSize);

		{
			std::istringstream	in	(std::string(&buffer[0], (size_t)bufferSize));

			m_caseTree = parseCaseList(in);
		}
	}
	else if (cmdLine.getOption<opt::StdinCaseList>())
	{
		m_caseTree = parseCaseList(std::cin);
	}
	else if (cmdLine.hasOption<opt::CasePath>())
		m_casePaths = de::MovePtr<const CasePaths>(new CasePaths(cmdLine.getOption<opt::CasePath>()));
}